

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsondocument.cpp
# Opt level: O3

QJsonDocument * __thiscall QJsonDocument::operator=(QJsonDocument *this,QJsonDocument *other)

{
  pointer __p;
  pointer __p_00;
  _Head_base<0UL,_QJsonDocumentPrivate_*,_false> other_00;
  _Head_base<0UL,_QJsonDocumentPrivate_*,_false> this_00;
  long in_FS_OFFSET;
  __uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this != other) {
    other_00._M_head_impl =
         (other->d)._M_t.
         super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>.
         _M_t.
         super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
         super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl;
    if (other_00._M_head_impl == (QJsonDocumentPrivate *)0x0) {
      std::__uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>::reset
                ((__uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>
                  *)this,(pointer)0x0);
    }
    else {
      this_00._M_head_impl =
           (this->d)._M_t.
           super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>.
           _M_t.
           super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>
           .super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl;
      if (this_00._M_head_impl == (QJsonDocumentPrivate *)0x0) {
        __p_00 = (pointer)operator_new(0x18);
        *(undefined8 *)&(__p_00->value).t = 0;
        (__p_00->value).n = 0;
        (__p_00->value).container = (QCborContainerPrivate *)0x0;
        (__p_00->value).t = Undefined;
        local_28._M_t.
        super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
        super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl =
             (tuple<QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>)
             (_Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>)
             0x0;
        std::__uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>::
        reset((__uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> *)
              this,__p_00);
        std::unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>::
        ~unique_ptr((unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> *)
                    &local_28);
        other_00._M_head_impl =
             (other->d)._M_t.
             super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>
             ._M_t.
             super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>
             .super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl;
        this_00._M_head_impl =
             (this->d)._M_t.
             super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>
             ._M_t.
             super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>
             .super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl;
      }
      QCborValue::operator=((QCborValue *)this_00._M_head_impl,&(other_00._M_head_impl)->value);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QJsonDocument &QJsonDocument::operator =(const QJsonDocument &other)
{
    if (this != &other) {
        if (other.d) {
            if (!d)
                d = std::make_unique<QJsonDocumentPrivate>();
            d->value = other.d->value;
        } else {
            d.reset();
        }
    }
    return *this;
}